

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigInteger.cpp
# Opt level: O2

void xercesc_4_0::XMLBigInteger::parseBigInteger
               (XMLCh *toConvert,XMLCh *retBuffer,int *signValue,MemoryManager *manager)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  XMLCh *pXVar3;
  NumberFormatException *this;
  long lVar4;
  long lVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  
  if ((toConvert == (XMLCh *)0x0) || (XVar1 = *toConvert, XVar1 == L'\0')) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
               ,0x68,XMLNUM_emptyString,manager);
LAB_00261952:
    __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  lVar5 = 0;
  while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar1] < '\0') {
    lVar4 = lVar5 + 2;
    lVar5 = lVar5 + 2;
    XVar1 = *(XMLCh *)((long)toConvert + lVar4);
  }
  if (XVar1 == L'\0') {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
               ,0x76,XMLNUM_WSString,manager);
    goto LAB_00261952;
  }
  XVar2 = XMLString::stringLen(toConvert);
  lVar4 = lVar5 + XVar2 * -2;
  pXVar3 = toConvert + XVar2 + 1;
  do {
    pXVar7 = pXVar3 + -2;
    lVar4 = lVar4 + 2;
    pXVar3 = pXVar3 + -1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar7] < '\0');
  *signValue = 1;
  XVar1 = *(XMLCh *)((long)toConvert + lVar5);
  if (XVar1 == L'+') {
    if (lVar4 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                 ,0x96,XMLNUM_Inv_chars,manager);
      goto LAB_00261952;
    }
  }
  else {
    pXVar7 = (XMLCh *)((long)toConvert + lVar5);
    if (XVar1 != L'-') goto LAB_002618d5;
    *signValue = -1;
    if (lVar4 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                 ,0x8d,XMLNUM_Inv_chars,manager);
      goto LAB_00261952;
    }
  }
  pXVar7 = (XMLCh *)((long)toConvert + lVar5 + 2);
LAB_002618d5:
  do {
    pXVar6 = pXVar7;
    pXVar7 = pXVar6 + 1;
  } while (*pXVar6 == L'0');
  if (pXVar6 < pXVar3) {
    for (lVar5 = -2; (XMLCh *)(lVar5 + (long)pXVar7) < pXVar3; lVar5 = lVar5 + 2) {
      if ((ushort)(*(short *)((long)pXVar7 + lVar5) - 0x3aU) < 0xfff6) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                   ,0xab,XMLNUM_Inv_chars,manager);
        goto LAB_00261952;
      }
      *(short *)((long)retBuffer + lVar5 + 2) = *(short *)((long)pXVar7 + lVar5);
    }
    *(undefined2 *)((long)retBuffer + lVar5 + 2) = 0;
  }
  else {
    *signValue = 0;
  }
  return;
}

Assistant:

void XMLBigInteger::parseBigInteger(const XMLCh* const toConvert
                                  , XMLCh* const retBuffer
                                  , int&   signValue
                                  , MemoryManager* const manager)
{
    // If no string, then its a failure
    if ((!toConvert) || (!*toConvert))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, manager);

    //
    // Note: in Java's BigInteger, it seems any leading and/or trailing
    // whitespaces are not allowed. If this is the case, we may
    // need to skip the trimming below.
    //

    // Scan past any whitespace. If we hit the end, then return failure
    const XMLCh* startPtr = toConvert;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Start at the end and work back through any whitespace
    const XMLCh* endPtr = toConvert + XMLString::stringLen(toConvert);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    //
    //  Work through what remains and convert each char to a digit.
    //  anything other than '
    //
    XMLCh* retPtr = retBuffer;
    signValue = 1;

    //
    // '+' or '-' is allowed only at the first position
    //
    if (*startPtr == chDash)
    {
        signValue = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        // skip the '+'
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }


    // Scan past any leading zero.
    while (*startPtr == chDigit_0)
        startPtr++;

    if (startPtr >= endPtr)
    {
        signValue = 0;
        // containning zero, only zero, nothing but zero
        // it is a zero, indeed
        return;
    }

    while (startPtr < endPtr)
    {
        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr = *startPtr;
        retPtr++;
        startPtr++;
    }

    *retPtr = 0;   //terminated
    return;
}